

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O2

int memory_read_open(archive *a,void *client_data)

{
  return 0;
}

Assistant:

static int
memory_read_open(struct archive *a, void *_private)
{
	struct fileblocks *private = _private;

	(void)a; /* UNUSED */

	private->current = private->first;
	private->fileposition = 0;
	if (private->current != NULL) {
		private->buff = private->current->buff;
		private->gap_remaining = private->current->gap_size;
	}
	return (ARCHIVE_OK);
}